

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  uint *puVar1;
  ErrorReporter *pEVar2;
  Reader source_00;
  Reader source_01;
  Reader source_02;
  Reader source_03;
  Reader source_04;
  Reader subSource;
  Reader subSource_00;
  ImplicitParams implicitMethodParams_00;
  ImplicitParams implicitMethodParams_01;
  ImplicitParams implicitMethodParams_02;
  Reader name_00;
  long lVar3;
  long *plVar4;
  NullableValue<capnp::compiler::BrandedDecl> *pNVar5;
  StructPointerCount SVar6;
  undefined8 uVar7;
  BrandedDecl *pBVar8;
  BrandedDecl *pBVar9;
  BrandedDecl *pBVar10;
  undefined3 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined2 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined3 uVar26;
  undefined4 uVar27;
  undefined1 uVar28;
  undefined7 uVar29;
  undefined7 uVar30;
  size_t sVar31;
  undefined7 uVar32;
  undefined1 uVar33;
  undefined4 uVar34;
  int iVar35;
  undefined4 uVar36;
  BrandScope *pBVar37;
  CapTableReader *pCVar38;
  Maybe<capnp::compiler::BrandedDecl> *pMVar39;
  undefined2 uVar40;
  undefined4 uVar41;
  uint uVar42;
  WirePointer *pWVar43;
  char *pcVar44;
  SegmentReader *pSVar45;
  ArrayPtr<const_char> *pAVar46;
  ArrayPtr<const_char> *pAVar47;
  WirePointer *pWVar48;
  undefined4 uVar49;
  ulong uVar50;
  Disposer *pDVar51;
  ElementCount index;
  uint uVar52;
  Reader *pRVar53;
  ulong uVar54;
  SegmentReader *pSVar55;
  undefined1 uVar56;
  unsigned_long i;
  undefined8 uVar57;
  Refcounted *refcounted;
  Disposer *capacity;
  undefined8 uVar58;
  bool bVar59;
  Reader RVar60;
  StringPtr memberName;
  NullableValue<capnp::compiler::BrandedDecl> _memberDecl658;
  NullableValue<capnp::compiler::BrandedDecl> _decl656;
  Reader name;
  Reader param;
  ArrayBuilder<capnp::compiler::BrandedDecl> compiledParams;
  Reader name_2;
  Array<capnp::compiler::BrandedDecl> result_2;
  undefined6 uVar61;
  undefined1 in_stack_fffffffffffffaef;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 in_stack_fffffffffffffaf4;
  undefined7 in_stack_fffffffffffffaf8;
  undefined7 uVar65;
  undefined7 uVar66;
  undefined1 in_stack_fffffffffffffaff;
  undefined1 uVar67;
  undefined1 uVar68;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  undefined7 uStack_4f0;
  undefined1 uStack_4e9;
  undefined7 uStack_4e8;
  undefined1 uStack_4e1;
  undefined1 local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined8 uStack_4a0;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [104];
  Disposer *local_400;
  BrandScope *local_3f8;
  BrandScope *pBStack_3f0;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  int iStack_3dc;
  undefined4 uStack_3d8;
  uint uStack_3d4;
  StructDataBitCount local_3d0;
  undefined4 uStack_3cc;
  uint uStack_3c8;
  undefined4 uStack_3c4;
  uint uStack_3c0;
  undefined4 uStack_3bc;
  BrandScope *local_3b0;
  SegmentReader *local_3a8;
  WirePointer *local_3a0;
  ListReader local_398;
  StructReader local_368;
  BrandedDecl *local_338;
  BrandedDecl *pBStack_330;
  BrandedDecl *local_328;
  ArrayDisposer *local_320;
  Maybe<capnp::compiler::BrandedDecl> local_318;
  String local_268;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  uint local_248;
  undefined4 uStack_244;
  uint uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 local_234;
  int local_230;
  undefined8 local_228;
  undefined4 local_218;
  undefined4 local_214;
  int local_210;
  Reader *local_208;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined8 local_1c8;
  Array<capnp::compiler::BrandedDecl> local_1b8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_188;
  PointerReader local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  pSVar45 = source._reader.segment;
  uVar58 = source._reader.capTable;
  pWVar43 = source._reader.pointers;
  SVar6 = source._reader.pointerCount;
  uVar52 = source._reader.nestingLimit;
  if (source._reader.dataSize < 0x10) {
    uVar40 = 0;
  }
  else {
    uVar40 = *source._reader.data;
  }
  local_3b0 = this;
  switch(uVar40) {
  case 0:
    goto switchD_0015e182_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
  case 7:
  case 8:
  case 0xd:
    uVar50 = 0;
    uVar54 = 0;
    if (0x3f < source._reader.dataSize) {
      uVar54 = (ulong)*(uint *)((long)source._reader.data + 4);
    }
    if (0x9f < source._reader.dataSize) {
      uVar50 = (ulong)*(uint *)((long)source._reader.data + 0x10);
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar54,uVar50,"Expected name.",0xf);
    goto switchD_0015e182_caseD_0;
  case 5:
    local_468._8_8_ = source._reader.capTable;
    local_468._0_8_ = source._reader.segment;
    local_468._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_468._8_8_ = (CapTableReader *)0x0;
      pWVar43 = (WirePointer *)0x0;
      local_468._0_8_ = (SegmentReader *)0x0;
      local_468._24_4_ = 0x7fffffff;
    }
    local_468._16_4_ = SUB84(pWVar43,0);
    local_468._20_4_ = (undefined4)((ulong)pWVar43 >> 0x20);
    pCVar38 = (CapTableReader *)0x0;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_318,(PointerReader *)local_468,(word *)0x0);
    local_468._16_4_ = 0;
    local_468._20_4_ = 0;
    local_468._0_8_ = (SegmentReader *)0x0;
    local_468._24_4_ = 0x7fffffff;
    if (local_318.ptr.field_1._28_2_ != 0) {
      local_468._0_8_ =
           CONCAT17(local_318.ptr._7_1_,CONCAT61(local_318.ptr._1_6_,local_318.ptr.isSet));
      pCVar38 = (CapTableReader *)
                CONCAT44(local_318.ptr.field_1._4_4_,local_318.ptr.field_1.value.body.tag);
      local_468._24_4_ = local_318.ptr.field_1._32_4_;
      local_468._16_4_ = local_318.ptr.field_1._16_4_;
      local_468._20_4_ = local_318.ptr.field_1._20_4_;
    }
    local_468._8_8_ = pCVar38;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_468,(void *)0x0,0)
    ;
    pAVar46 = RVar60.super_StringPtr.content.size_;
    local_3a8 = RVar60.super_StringPtr.content.ptr;
    uVar50 = (ulong)implicitMethodParams.params.reader.elementCount;
    if (uVar50 != 0) {
      pRVar53 = &(__return_storage_ptr__->ptr).field_1.value.source;
      local_3a0 = (WirePointer *)&(__return_storage_ptr__->ptr).field_1.value.brand;
      uVar54 = 0;
      do {
        uVar42 = (uint)uVar54;
        capnp::_::ListReader::getStructElement
                  ((StructReader *)local_468,&implicitMethodParams.params.reader,uVar42);
        if (local_468._36_2_ == 0) {
          pCVar38 = (CapTableReader *)0x0;
          uVar58 = 0;
        }
        else {
          uVar58 = CONCAT44(local_468._28_4_,local_468._24_4_);
          pCVar38 = (CapTableReader *)local_468._8_8_;
        }
        in_stack_fffffffffffffaf0 = SUB84(pCVar38,0);
        in_stack_fffffffffffffaf8 = (undefined7)uVar58;
        in_stack_fffffffffffffaff = (undefined1)((ulong)uVar58 >> 0x38);
        bVar59 = false;
        RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&stack0xfffffffffffffae8,(void *)0x0,0);
        pAVar47 = RVar60.super_StringPtr.content.size_;
        if (pAVar47 == pAVar46) {
          if (pAVar47 == (ArrayPtr<const_char> *)0x0) {
            bVar59 = true;
          }
          else {
            iVar35 = bcmp(RVar60.super_StringPtr.content.ptr,local_3a8,(size_t)pAVar47);
            bVar59 = iVar35 == 0;
          }
        }
        if (bVar59) {
          if (implicitMethodParams.scopeId == 0) {
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (pRVar53->_reader).segment = (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar5 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar5->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar5->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = 0;
          }
          else {
            uVar42 = uVar42 & 0xffff;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0
            ;
            (pRVar53->_reader).segment = (SegmentReader *)0x0;
            (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
                 (CapTableReader *)0x0;
            pNVar5 = &__return_storage_ptr__->ptr;
            *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = 0;
            *(StructPointerCount *)((long)&pNVar5->field_1 + 0x9c) = 0;
            *(undefined2 *)((long)&pNVar5->field_1 + 0x9e) = 0;
            (__return_storage_ptr__->ptr).isSet = true;
            (__return_storage_ptr__->ptr).field_1.value.body.tag = 2;
            *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 implicitMethodParams.scopeId;
          }
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar42;
          *(Disposer **)&local_3a0->offsetAndKind = (Disposer *)0x0;
          *(BrandScope **)((long)local_3a0 + 8) = (BrandScope *)0x0;
          *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
               0x7fffffff;
          if (bVar59) {
            return __return_storage_ptr__;
          }
        }
        uVar54 = uVar54 + 1;
      } while (uVar50 != uVar54);
    }
    pAVar47 = pAVar46;
    (**resolver->_vptr_Resolver)(local_468,resolver,local_3a8);
    pBVar37 = local_3b0;
    if (local_468[0] == '\x01') {
      in_stack_fffffffffffffaf0 = local_468._8_4_;
      pAVar47 = (ArrayPtr<const_char> *)(local_468._8_8_ & 0xffffffff);
      uVar56 = SUB41(local_468._20_4_,3);
      if (local_468._8_4_ == 2) {
        in_stack_fffffffffffffaf8 = (undefined7)CONCAT44(local_468._20_4_,local_468._16_4_);
        in_stack_fffffffffffffaff = uVar56;
      }
      else if ((local_468._8_4_ == 1) &&
              (in_stack_fffffffffffffaf8 = (undefined7)CONCAT44(local_468._20_4_,local_468._16_4_),
              in_stack_fffffffffffffaff = uVar56, local_468[0x38] == 1)) {
        local_468[0x38] = 0;
      }
      if (local_468._8_4_ == 1) {
        local_468._8_8_ = local_468._8_8_ & 0xffffffff00000000;
      }
      if (local_468._8_4_ == 2) {
        local_468._8_8_ = local_468._8_8_ & 0xffffffff00000000;
      }
    }
    if (local_468[0] == '\0') {
      pEVar2 = local_3b0->errorReporter;
      local_398.segment = (SegmentReader *)0x221927;
      local_398.capTable = (CapTableReader *)0xd;
      local_368.capTable = (CapTableReader *)((long)&pAVar46[-1].size_ + 7);
      local_368.segment = local_3a8;
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_468,(_ *)&local_398,(ArrayPtr<const_char> *)&local_368,pAVar47);
      pSVar45 = (SegmentReader *)local_468._0_8_;
      if ((CapTableReader *)local_468._8_8_ == (CapTableReader *)0x0) {
        pSVar45 = (SegmentReader *)0x237f1b;
      }
      uVar50 = 0;
      uVar54 = 0;
      if (0x1f < (uint)local_318.ptr.field_1._24_4_) {
        uVar54 = (ulong)*(uint *)CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_);
      }
      if (0x3f < (uint)local_318.ptr.field_1._24_4_) {
        uVar50 = (ulong)*(uint *)(CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_)
                                 + 4);
      }
      (**pEVar2->_vptr_ErrorReporter)
                (pEVar2,uVar54,uVar50,pSVar45,
                 local_468._8_8_ +
                 (ulong)((CapTableReader *)local_468._8_8_ == (CapTableReader *)0x0));
      uVar57 = local_468._8_8_;
      uVar58 = local_468._0_8_;
      if ((SegmentReader *)local_468._0_8_ != (SegmentReader *)0x0) {
        local_468._0_8_ = (SegmentReader *)0x0;
        local_468._8_8_ = (CapTableReader *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(local_468._20_4_,local_468._16_4_))
                  ((undefined8 *)CONCAT44(local_468._20_4_,local_468._16_4_),uVar58,1,uVar57,uVar57,
                   0);
      }
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      source_02._reader.pointerCount = source._reader.pointerCount;
      source_02._reader.dataSize = source._reader.dataSize;
      source_02._reader._38_2_ = source._reader._38_2_;
      source_02._reader._44_4_ = source._reader._44_4_;
      source_02._reader.nestingLimit = source._reader.nestingLimit;
      source_02._reader.capTable = source._reader.capTable;
      source_02._reader.segment = source._reader.segment;
      source_02._reader.data = source._reader.data;
      source_02._reader.pointers = source._reader.pointers;
      interpretResolve((BrandedDecl *)local_468,local_3b0,resolver,
                       (ResolveResult *)&stack0xfffffffffffffaf0,source_02);
      if (in_stack_fffffffffffffaf0 == 1) {
        local_1d4 = 0;
        local_1d8 = 0;
        if (0x3f < source._reader.dataSize) {
          local_1d8 = *(undefined4 *)((long)source._reader.data + 4);
        }
        if (0x9f < source._reader.dataSize) {
          local_1d4 = *(undefined4 *)((long)source._reader.data + 0x10);
        }
        local_1c8 = CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8);
        local_1d0 = 1;
        (*pBVar37->errorReporter->_vptr_ErrorReporter[2])();
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_468._0_4_;
      if (local_468._0_4_ == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_468._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_468._20_4_,local_468._16_4_);
      }
      else if (local_468._0_4_ == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_468._40_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT44(local_468._28_4_,local_468._24_4_);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             CONCAT26(local_468._38_2_,CONCAT24(local_468._36_2_,local_468._32_4_));
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_468._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_468._20_4_,local_468._16_4_);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_468[0x30];
        if (local_468[0x30] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_468._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_468._96_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_468._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_468._80_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               CONCAT71(local_468._57_7_,local_468[0x38]);
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_468._64_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_400;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_3f8;
      pNVar5 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = local_3d0;
      *(short *)((long)&pNVar5->field_1 + 0x9c) = (short)uStack_3cc;
      *(short *)((long)&pNVar5->field_1 + 0x9e) = SUB42(uStack_3cc,2);
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           CONCAT44(uStack_3c4,uStack_3c8);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
           (void *)CONCAT44(iStack_3dc,uStack_3e0);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           (WirePointer *)CONCAT44(uStack_3d4,uStack_3d8);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
           (SegmentReader *)pBStack_3f0;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           (CapTableReader *)CONCAT44(uStack_3e4,uStack_3e8);
    }
    break;
  case 9:
    pDVar51 = (Disposer *)(ulong)(uint)source._reader.nestingLimit;
    pCVar38 = source._reader.capTable;
    pWVar48 = source._reader.pointers;
    pSVar55 = source._reader.segment;
    uVar41 = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar38 = (CapTableReader *)0x0;
      pWVar48 = (WirePointer *)0x0;
      pSVar55 = (SegmentReader *)0x0;
      uVar41 = 0x7fffffff;
    }
    bVar59 = SUB81(pSVar55,0);
    uVar62 = SUB84(pCVar38,0);
    uVar65 = SUB87(pWVar48,0);
    uVar56 = (undefined1)((ulong)pWVar48 >> 0x38);
    capnp::_::PointerReader::getStruct
              (&local_60,(PointerReader *)&stack0xfffffffffffffae8,(word *)0x0);
    implicitMethodParams_01.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_01.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_03._reader.capTable = local_60.capTable;
    source_03._reader.segment = local_60.segment;
    source_03._reader.data = local_60.data;
    source_03._reader.pointers = local_60.pointers;
    source_03._reader.dataSize = local_60.dataSize;
    source_03._reader.pointerCount = local_60.pointerCount;
    source_03._reader._38_2_ = local_60._38_2_;
    source_03._reader.nestingLimit = local_60.nestingLimit;
    source_03._reader._44_4_ = local_60._44_4_;
    implicitMethodParams_01.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_01.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_01.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_01.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_01.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_01.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_01.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_01.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_01.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_01.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)&stack0xfffffffffffffae8,local_3b0,source_03,
               resolver,implicitMethodParams_01);
    uVar63 = local_468._16_4_;
    local_468[0] = bVar59;
    if (bVar59 == true) {
      local_468._8_4_ = uVar62;
      local_468._16_4_ = (undefined4)uVar65;
      if (uVar62 == 2) {
        local_468._20_4_ = (undefined4)(CONCAT17(uVar56,uVar65) >> 0x20);
        uVar63 = local_468._16_4_;
        local_468._24_4_ = uVar41;
        local_468._28_4_ = in_stack_fffffffffffffb04;
      }
      else if (uVar62 == 1) {
        local_468._48_8_ = CONCAT17(uStack_4e1,uStack_4e8);
        local_468._40_8_ = CONCAT17(uStack_4e9,uStack_4f0);
        local_468._36_2_ = (undefined2)in_stack_fffffffffffffb0c;
        local_468._38_2_ = (undefined2)((uint)in_stack_fffffffffffffb0c >> 0x10);
        local_468._20_4_ = (undefined4)(CONCAT17(uVar56,uVar65) >> 0x20);
        local_468[0x38] = local_4e0;
        uVar63 = local_468._16_4_;
        local_468._24_4_ = uVar41;
        local_468._28_4_ = in_stack_fffffffffffffb04;
        local_468._32_4_ = in_stack_fffffffffffffb08;
        if (local_4e0 == 1) {
          local_468._96_8_ = local_4b8;
          local_400 = (Disposer *)uStack_4b0;
          local_468._80_8_ = local_4c8;
          local_468._88_8_ = uStack_4c0;
          local_468._64_8_ = local_4d8;
          local_468._72_8_ = uStack_4d0;
          local_4e0 = 0;
        }
      }
      local_468._16_4_ = uVar63;
      local_3f8 = (BrandScope *)CONCAT44(uStack_4a4,local_4a8);
      uStack_3bc = uStack_46c;
      uStack_3c0 = uStack_470;
      uStack_3c4 = uStack_474;
      uStack_3c8 = local_478;
      uStack_3cc = uStack_47c;
      local_3d0 = uStack_480;
      uStack_3d4 = uStack_484;
      uStack_3d8 = local_488;
      iStack_3dc = uStack_48c;
      uStack_3e0 = uStack_490;
      uStack_3e4 = uStack_494;
      uStack_3e8 = local_498;
      pBStack_3f0 = (BrandScope *)uStack_4a0;
      uStack_4a0 = (BrandScope *)0x0;
    }
    if (bVar59 == true) {
      if (SVar6 < 2) {
        pDVar51 = (Disposer *)0x7fffffff;
        uVar58 = (BrandScope *)0x0;
        pWVar43 = (WirePointer *)0x0;
        pSVar45 = (SegmentReader *)0x0;
      }
      else {
        pWVar43 = pWVar43 + 1;
      }
      bVar59 = SUB81(pSVar45,0);
      uVar64 = (undefined4)uVar58;
      uVar66 = SUB87(pWVar43,0);
      uVar68 = (undefined1)((ulong)pWVar43 >> 0x38);
      uVar49 = SUB84(pDVar51,0);
      capnp::_::PointerReader::getList
                (&local_398,(PointerReader *)&stack0xfffffffffffffae8,INLINE_COMPOSITE,(word *)0x0);
      capacity = (Disposer *)(ulong)local_398.elementCount;
      local_338 = (BrandedDecl *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0xa8,0,(size_t)capacity,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
      uVar29 = local_318.ptr.field_1._40_7_;
      uVar27 = local_318.ptr.field_1._36_4_;
      uVar24 = local_318.ptr.field_1._32_4_;
      uVar22 = local_318.ptr.field_1._31_1_;
      uVar20 = local_318.ptr.field_1._30_1_;
      uVar40 = local_318.ptr.field_1._28_2_;
      uVar17 = local_318.ptr.field_1._24_4_;
      uVar15 = local_318.ptr.field_1._20_4_;
      uVar36 = local_318.ptr.field_1._16_4_;
      uVar12 = local_318.ptr.field_1._15_1_;
      uVar65 = local_318.ptr.field_1._8_7_;
      uVar62 = local_318.ptr.field_1._4_4_;
      uVar41 = local_318.ptr.field_1.value.body.tag;
      uVar56 = local_318.ptr._7_1_;
      local_328 = local_338 + (long)capacity;
      local_320 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_3a0 = (WirePointer *)CONCAT44(local_3a0._4_4_,local_398.elementCount);
      local_318.ptr.field_1._32_4_ = (undefined4)((ulong)local_4b8 >> 8);
      uVar25 = local_318.ptr.field_1._32_4_;
      local_318.ptr.field_1._31_1_ = (undefined1)local_4b8;
      uVar23 = local_318.ptr.field_1._31_1_;
      local_318.ptr.field_1._36_3_ = (undefined3)((ulong)local_4b8 >> 0x28);
      uVar26 = local_318.ptr.field_1._36_3_;
      local_318.ptr.field_1._40_7_ = (undefined7)((ulong)uStack_4b0 >> 8);
      uVar30 = local_318.ptr.field_1._40_7_;
      local_318.ptr.field_1._39_1_ = (undefined1)uStack_4b0;
      uVar28 = local_318.ptr.field_1._39_1_;
      local_318.ptr.field_1._16_4_ = (undefined4)((ulong)local_4c8 >> 8);
      uVar34 = local_318.ptr.field_1._16_4_;
      local_318.ptr.field_1._15_1_ = (undefined1)local_4c8;
      uVar13 = local_318.ptr.field_1._15_1_;
      local_318.ptr.field_1._20_3_ = (undefined3)((ulong)local_4c8 >> 0x28);
      uVar14 = local_318.ptr.field_1._20_3_;
      local_318.ptr.field_1._24_4_ = (undefined4)((ulong)uStack_4c0 >> 8);
      uVar18 = local_318.ptr.field_1._24_4_;
      local_318.ptr.field_1._23_1_ = (undefined1)uStack_4c0;
      uVar16 = local_318.ptr.field_1._23_1_;
      local_318.ptr.field_1._30_1_ = (undefined1)((ulong)uStack_4c0 >> 0x38);
      uVar21 = local_318.ptr.field_1._30_1_;
      local_318.ptr.field_1._28_2_ = (undefined2)((ulong)uStack_4c0 >> 0x28);
      uVar19 = local_318.ptr.field_1._28_2_;
      local_318.ptr.field_1.value.body.tag = (uint)((ulong)local_4d8 >> 8);
      uVar63 = local_318.ptr.field_1.value.body.tag;
      local_318.ptr._7_1_ = SUB81(local_4d8,0);
      uVar67 = local_318.ptr._7_1_;
      local_318.ptr.field_1._4_3_ = (undefined3)((ulong)local_4d8 >> 0x28);
      uVar11 = local_318.ptr.field_1._4_3_;
      local_318.ptr.field_1._8_7_ = (undefined7)((ulong)uStack_4d0 >> 8);
      uVar32 = local_318.ptr.field_1._8_7_;
      local_318.ptr.field_1._7_1_ = (undefined1)uStack_4d0;
      uVar33 = local_318.ptr.field_1._7_1_;
      pBStack_330 = local_338;
      local_318.ptr._7_1_ = uVar56;
      local_318.ptr.field_1.value.body.tag = uVar41;
      local_318.ptr.field_1._4_4_ = uVar62;
      local_318.ptr.field_1._8_7_ = uVar65;
      local_318.ptr.field_1._15_1_ = uVar12;
      local_318.ptr.field_1._16_4_ = uVar36;
      local_318.ptr.field_1._20_4_ = uVar15;
      local_318.ptr.field_1._24_4_ = uVar17;
      local_318.ptr.field_1._28_2_ = uVar40;
      local_318.ptr.field_1._30_1_ = uVar20;
      local_318.ptr.field_1._31_1_ = uVar22;
      local_318.ptr.field_1._32_4_ = uVar24;
      local_318.ptr.field_1._36_4_ = uVar27;
      local_318.ptr.field_1._40_7_ = uVar29;
      if (local_398.elementCount == 0) {
LAB_0015f994:
        uVar56 = SUB81(pWVar43,0);
        local_1b8.size_ = ((long)pBStack_330 - (long)local_338 >> 3) * -0x30c30c30c30c30c3;
        local_1b8.ptr = local_338;
        local_1b8.disposer = local_320;
        local_338 = (BrandedDecl *)0x0;
        pBStack_330 = (BrandedDecl *)0x0;
        local_328 = (BrandedDecl *)0x0;
        subSource._reader.pointerCount = source._reader.pointerCount;
        subSource._reader.dataSize = source._reader.dataSize;
        subSource._reader._38_2_ = source._reader._38_2_;
        subSource._reader._44_4_ = source._reader._44_4_;
        subSource._reader.nestingLimit = source._reader.nestingLimit;
        subSource._reader.capTable = source._reader.capTable;
        subSource._reader.segment = source._reader.segment;
        subSource._reader.data = source._reader.data;
        subSource._reader.pointers = source._reader.pointers;
        BrandedDecl::applyParams
                  ((Maybe<capnp::compiler::BrandedDecl> *)&stack0xfffffffffffffae8,
                   (BrandedDecl *)(local_468 + 8),&local_1b8,subSource);
        sVar31 = local_1b8.size_;
        pBVar8 = local_1b8.ptr;
        uVar41 = (uint)&source;
        if (bVar59 == true) {
          if (uVar64 == 2) {
            local_268.content.size_._3_1_ = uVar68;
            local_268.content._4_7_ = uVar66;
            local_268.content.size_._4_4_ = uVar49;
            local_268.content.disposer._0_4_ = in_stack_fffffffffffffb04;
          }
          else if (uVar64 == 1) {
            uStack_244 = (undefined4)uStack_4e8;
            uStack_240 = (uint)(CONCAT17(uStack_4e1,uStack_4e8) >> 0x20);
            local_268.content.size_._3_1_ = uVar68;
            local_268.content._4_7_ = uVar66;
            uStack_24c = (undefined4)uStack_4f0;
            local_248 = (uint)(CONCAT17(uStack_4e9,uStack_4f0) >> 0x20);
            uVar56 = local_4e0;
            local_268.content.size_._4_4_ = uVar49;
            local_268.content.disposer._0_4_ = in_stack_fffffffffffffb04;
            local_268.content.disposer._4_4_ = in_stack_fffffffffffffb08;
            uStack_250 = in_stack_fffffffffffffb0c;
            if (local_4e0 == 1) {
              local_318.ptr.field_1._36_4_ = CONCAT13(uVar28,uVar26);
              local_318.ptr.field_1._20_4_ = CONCAT13(uVar16,uVar14);
              local_318.ptr.field_1._4_4_ = CONCAT13(uVar33,uVar11);
              local_318.ptr._7_1_ = uVar67;
              local_318.ptr.field_1.value.body.tag = uVar63;
              local_318.ptr.field_1._8_7_ = uVar32;
              local_318.ptr.field_1._15_1_ = uVar13;
              local_318.ptr.field_1._16_4_ = uVar34;
              local_318.ptr.field_1._24_4_ = uVar18;
              local_318.ptr.field_1._28_2_ = uVar19;
              local_318.ptr.field_1._30_1_ = uVar21;
              local_318.ptr.field_1._31_1_ = uVar23;
              local_318.ptr.field_1._32_4_ = uVar25;
              local_318.ptr.field_1._40_7_ = uVar30;
            }
          }
          capacity = (Disposer *)CONCAT44(uStack_4a4,local_4a8);
          local_368.segment = (SegmentReader *)CONCAT44(uStack_494,local_498);
          local_368.capTable = (CapTableReader *)CONCAT44(uStack_48c,uStack_490);
          local_368.data = (void *)CONCAT44(uStack_484,local_488);
          local_368.pointers = (WirePointer *)CONCAT44(uStack_47c,uStack_480);
          local_368._44_4_ = uStack_46c;
          local_368.nestingLimit = uStack_470;
          local_368._36_4_ = uStack_474;
          local_368.dataSize = local_478;
          uVar58 = uStack_4a0;
          uVar41 = uVar64;
        }
        if (local_1b8.ptr != (BrandedDecl *)0x0) {
          local_1b8.ptr = (BrandedDecl *)0x0;
          local_1b8.size_ = 0;
          (**(local_1b8.disposer)->_vptr_ArrayDisposer)
                    (local_1b8.disposer,pBVar8,0xa8,sVar31,sVar31,
                     kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
        }
        (__return_storage_ptr__->ptr).isSet = true;
        if (bVar59 == false) {
          (__return_storage_ptr__->ptr).field_1.value.body.tag = local_468._8_4_;
          if (local_468._8_4_ == 2) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(local_468._20_4_,local_468._16_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_468._28_4_,local_468._24_4_);
          }
          else if (local_468._8_4_ == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_468._48_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
                 CONCAT26(local_468._38_2_,CONCAT24(local_468._36_2_,local_468._32_4_));
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_468._40_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 CONCAT44(local_468._20_4_,local_468._16_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_468._28_4_,local_468._24_4_);
            *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_468[0x38];
            if (local_468[0x38] == 1) {
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                   local_468._96_8_;
              *(Disposer **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_400;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                   local_468._80_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                   local_468._88_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                   local_468._64_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                   local_468._72_8_;
              local_468[0x38] = 0;
            }
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_3f8;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_3f0;
          pBStack_3f0 = (BrandScope *)0x0;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) = uStack_3c8;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = uStack_3c4;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = uStack_3c0;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = uStack_3bc;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) = uStack_3d8;
          *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) = uStack_3d4;
          *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) = local_3d0;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) = uStack_3cc;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) = uStack_3e8;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) = uStack_3e4;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = uStack_3e0;
          *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) = iStack_3dc;
        }
        else {
          (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar41;
          if (uVar41 == 2) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 local_268.content._4_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_268.content.disposer._0_4_,local_268.content.size_._4_4_);
          }
          else if (uVar41 == 1) {
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
                 CONCAT44(uStack_240,uStack_244);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
                 CONCAT44(uStack_250,local_268.content.disposer._4_4_);
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
                 CONCAT44(local_248,uStack_24c);
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
                 local_268.content._4_8_;
            *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
                 CONCAT44(local_268.content.disposer._0_4_,local_268.content.size_._4_4_);
            *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = uVar56;
            if ((uVar56 & 1) != 0) {
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
                   CONCAT35(local_318.ptr.field_1._36_3_,
                            CONCAT41(local_318.ptr.field_1._32_4_,local_318.ptr.field_1._31_1_));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) =
                   CONCAT71(local_318.ptr.field_1._40_7_,local_318.ptr.field_1._39_1_);
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
                   CONCAT35(local_318.ptr.field_1._20_3_,
                            CONCAT41(local_318.ptr.field_1._16_4_,local_318.ptr.field_1._15_1_));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
                   CONCAT17(local_318.ptr.field_1._30_1_,
                            CONCAT25(local_318.ptr.field_1._28_2_,
                                     CONCAT41(local_318.ptr.field_1._24_4_,
                                              local_318.ptr.field_1._23_1_)));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
                   CONCAT35(local_318.ptr.field_1._4_3_,
                            CONCAT41(local_318.ptr.field_1.value.body.tag,local_318.ptr._7_1_));
              *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
                   CONCAT71(local_318.ptr.field_1._8_7_,local_318.ptr.field_1._7_1_);
            }
          }
          (__return_storage_ptr__->ptr).field_1.value.brand.disposer = capacity;
          (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uVar58;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) =
               local_368.segment._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) =
               local_368.segment._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) =
               local_368.capTable._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) =
               local_368.capTable._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x88) =
               local_368.data._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x8c) =
               local_368.data._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x90) =
               local_368.pointers._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x94) =
               local_368.pointers._4_4_;
          *(StructDataBitCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x98) =
               local_368.dataSize;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x9c) = local_368._36_4_;
          *(int *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa0) = local_368.nestingLimit;
          *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xa4) = local_368._44_4_;
          uVar58 = (BrandScope *)0x0;
        }
        if ((bVar59 & (BrandScope *)uVar58 != (BrandScope *)0x0) == 1) {
          (**capacity->_vptr_Disposer)
                    (capacity,&((NullableValue<capnp::compiler::BrandedDecl> *)
                               &((BrandScope *)uVar58)->super_Refcounted)->isSet +
                              *(long *)(*(long *)&((BrandScope *)uVar58)->super_Refcounted + -0x10))
          ;
        }
      }
      else {
        local_3a8 = (SegmentReader *)0x0;
        index = 0;
        uVar57 = __return_storage_ptr__;
        do {
          uVar7 = uStack_4a0;
          capnp::_::ListReader::getStructElement(&local_368,&local_398,index);
          if ((0xf < local_368.dataSize) && (*local_368.data == 1)) {
            pCVar38 = local_368.capTable;
            pWVar48 = local_368.pointers;
            pSVar45 = local_368.segment;
            local_318.ptr.field_1._16_4_ = local_368.nestingLimit;
            if (local_368.pointerCount == 0) {
              pCVar38 = (CapTableReader *)0x0;
              pWVar48 = (WirePointer *)0x0;
              pSVar45 = (SegmentReader *)0x0;
              local_318.ptr.field_1._16_4_ = 0x7fffffff;
            }
            capacity = (Disposer *)local_3b0->errorReporter;
            local_318.ptr.isSet = SUB81(pSVar45,0);
            local_318.ptr._1_6_ = SUB86((ulong)pSVar45 >> 8,0);
            local_318.ptr._7_1_ = SUB81((ulong)pSVar45 >> 0x38,0);
            local_318.ptr.field_1.value.body.tag = (uint)pCVar38;
            local_318.ptr.field_1._4_4_ = (undefined4)((ulong)pCVar38 >> 0x20);
            local_318.ptr.field_1._8_7_ = SUB87(pWVar48,0);
            local_318.ptr.field_1._15_1_ = (undefined1)((ulong)pWVar48 >> 0x38);
            capnp::_::PointerReader::getStruct
                      ((StructReader *)&stack0xfffffffffffffae8,(PointerReader *)&local_318,
                       (word *)0x0);
            uVar50 = 0;
            uVar54 = 0;
            if (0x1f < (uint)in_stack_fffffffffffffb08) {
              uVar54 = (ulong)*(uint *)CONCAT17(uVar68,uVar66);
            }
            if (0x3f < (uint)in_stack_fffffffffffffb08) {
              uVar50 = (ulong)*(uint *)(CONCAT17(uVar68,uVar66) + 4);
            }
            (**capacity->_vptr_Disposer)
                      (capacity,uVar54,uVar50,"Named parameter not allowed here.",0x22);
          }
          if (local_368.pointerCount < 2) {
            local_178.nestingLimit = 0x7fffffff;
            local_178.capTable = (CapTableReader *)0x0;
            local_178.pointer = (WirePointer *)0x0;
            local_178.segment = (SegmentReader *)0x0;
          }
          else {
            local_178.pointer = local_368.pointers + 1;
            local_178.capTable = local_368.capTable;
            local_178.segment = local_368.segment;
            local_178.nestingLimit = local_368.nestingLimit;
          }
          capnp::_::PointerReader::getStruct(&local_c0,&local_178,(word *)0x0);
          implicitMethodParams_02.params.reader.step = implicitMethodParams.params.reader.step;
          implicitMethodParams_02.params.reader.elementCount =
               implicitMethodParams.params.reader.elementCount;
          source_04._reader.capTable = local_c0.capTable;
          source_04._reader.segment = local_c0.segment;
          source_04._reader.data = local_c0.data;
          source_04._reader.pointers = local_c0.pointers;
          source_04._reader.dataSize = local_c0.dataSize;
          source_04._reader.pointerCount = local_c0.pointerCount;
          source_04._reader._38_2_ = local_c0._38_2_;
          source_04._reader.nestingLimit = local_c0.nestingLimit;
          source_04._reader._44_4_ = local_c0._44_4_;
          implicitMethodParams_02.params.reader.segment = implicitMethodParams.params.reader.segment
          ;
          implicitMethodParams_02.scopeId = implicitMethodParams.scopeId;
          implicitMethodParams_02.params.reader.capTable =
               implicitMethodParams.params.reader.capTable;
          implicitMethodParams_02.params.reader.ptr = implicitMethodParams.params.reader.ptr;
          implicitMethodParams_02.params.reader.structDataSize =
               implicitMethodParams.params.reader.structDataSize;
          implicitMethodParams_02.params.reader.structPointerCount =
               implicitMethodParams.params.reader.structPointerCount;
          implicitMethodParams_02.params.reader.elementSize =
               implicitMethodParams.params.reader.elementSize;
          implicitMethodParams_02.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
          implicitMethodParams_02.params.reader.nestingLimit =
               implicitMethodParams.params.reader.nestingLimit;
          implicitMethodParams_02.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
          pMVar39 = compileDeclExpression
                              ((Maybe<capnp::compiler::BrandedDecl> *)&stack0xfffffffffffffae8,
                               local_3b0,source_04,resolver,implicitMethodParams_02);
          capacity = (Disposer *)CONCAT71((int7)((ulong)capacity >> 8),bVar59);
          if (bVar59 == true) {
            uVar58 = ZEXT48((uint)uVar64);
            if (uVar64 == 2) {
              local_118 = CONCAT17(uVar68,uVar66);
              uStack_110 = CONCAT44(in_stack_fffffffffffffb04,uVar49);
            }
            else if (uVar64 == 1) {
              local_f8 = CONCAT17(uStack_4e1,uStack_4e8);
              local_118 = CONCAT17(uVar68,uVar66);
              uStack_110 = CONCAT44(in_stack_fffffffffffffb04,uVar49);
              local_108 = CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
              uStack_100 = CONCAT17(uStack_4e9,uStack_4f0);
              pWVar43 = (WirePointer *)(ulong)(byte)local_4e0;
              if (local_4e0 == 1) {
                local_318.ptr.field_1._36_4_ = CONCAT13(uVar28,uVar26);
                local_318.ptr.field_1._20_4_ = CONCAT13(uVar16,uVar14);
                local_318.ptr.field_1._4_4_ = CONCAT13(uVar33,uVar11);
                local_4e0 = 0;
                local_318.ptr._7_1_ = uVar67;
                local_318.ptr.field_1.value.body.tag = uVar63;
                local_318.ptr.field_1._8_7_ = uVar32;
                local_318.ptr.field_1._15_1_ = uVar13;
                local_318.ptr.field_1._16_4_ = uVar34;
                local_318.ptr.field_1._24_4_ = uVar18;
                local_318.ptr.field_1._28_2_ = uVar19;
                local_318.ptr.field_1._30_1_ = uVar21;
                local_318.ptr.field_1._31_1_ = uVar23;
                local_318.ptr.field_1._32_4_ = uVar25;
                local_318.ptr.field_1._40_7_ = uVar30;
              }
            }
            pDVar51 = (Disposer *)CONCAT44(uStack_4a4,local_4a8);
            pMVar39 = (Maybe<capnp::compiler::BrandedDecl> *)&stack0xfffffffffffffaf8;
            local_268.content.size_._0_4_ = uStack_490;
            local_268.content.ptr._4_4_ = uStack_494;
            uStack_23c = uStack_46c;
            uStack_240 = uStack_470;
            uStack_244 = uStack_474;
            local_248 = local_478;
            uStack_24c = uStack_47c;
            uStack_250 = uStack_480;
            local_268.content.disposer._4_4_ = uStack_484;
            local_268.content.disposer._0_4_ = local_488;
            local_268.content.size_._4_4_ = uStack_48c;
            local_268.content.ptr._0_4_ = local_498;
            uStack_4a0 = (BrandScope *)0x0;
            if (uVar64 == 1) {
              uVar64 = 0;
            }
            uVar57 = uVar7;
            if (uVar64 == 2) {
              uVar64 = 0;
            }
          }
          uVar42 = (uint)uVar58;
          if (bVar59 == false) {
            local_3a8 = (SegmentReader *)CONCAT71((int7)((ulong)pMVar39 >> 8),1);
          }
          else {
            (pBStack_330->body).tag = uVar42;
            if (uVar42 == 1) {
              *(undefined8 *)((long)&(pBStack_330->body).field_1 + 0x20) = local_f8;
              *(undefined8 *)((long)&(pBStack_330->body).field_1 + 0x10) = local_108;
              *(undefined8 *)((long)&(pBStack_330->body).field_1 + 0x18) = uStack_100;
              *(undefined8 *)&(pBStack_330->body).field_1 = local_118;
              *(undefined8 *)((long)&(pBStack_330->body).field_1 + 8) = uStack_110;
              (pBStack_330->body).field_1.space[0x28] = (byte)pWVar43;
              if (((ulong)pWVar43 & 1) != 0) {
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x50) =
                     CONCAT35(local_318.ptr.field_1._36_3_,
                              CONCAT41(local_318.ptr.field_1._32_4_,local_318.ptr.field_1._31_1_));
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x58) =
                     CONCAT71(local_318.ptr.field_1._40_7_,local_318.ptr.field_1._39_1_);
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x40) =
                     CONCAT35(local_318.ptr.field_1._20_3_,
                              CONCAT41(local_318.ptr.field_1._16_4_,local_318.ptr.field_1._15_1_));
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x48) =
                     CONCAT17(local_318.ptr.field_1._30_1_,
                              CONCAT25(local_318.ptr.field_1._28_2_,
                                       CONCAT41(local_318.ptr.field_1._24_4_,
                                                local_318.ptr.field_1._23_1_)));
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x30) =
                     CONCAT35(local_318.ptr.field_1._4_3_,
                              CONCAT41(local_318.ptr.field_1.value.body.tag,local_318.ptr._7_1_));
                *(ulong *)((long)&(pBStack_330->body).field_1 + 0x38) =
                     CONCAT71(local_318.ptr.field_1._8_7_,local_318.ptr.field_1._7_1_);
              }
              uVar50 = (ulong)pWVar43 & 1;
              pWVar43 = (WirePointer *)((ulong)pWVar43 & 0xff);
              if (uVar50 != 0) {
                pWVar43 = (WirePointer *)0x0;
              }
            }
            if (uVar42 == 2) {
              *(undefined8 *)&(pBStack_330->body).field_1 = local_118;
              *(undefined8 *)((long)&(pBStack_330->body).field_1 + 8) = uStack_110;
            }
            (pBStack_330->brand).disposer = pDVar51;
            (pBStack_330->brand).ptr = (BrandScope *)uVar57;
            *(undefined4 *)&(pBStack_330->source)._reader.segment = local_268.content.ptr._0_4_;
            *(undefined4 *)((long)&(pBStack_330->source)._reader.segment + 4) =
                 local_268.content.ptr._4_4_;
            *(undefined4 *)&(pBStack_330->source)._reader.capTable =
                 (undefined4)local_268.content.size_;
            *(undefined4 *)((long)&(pBStack_330->source)._reader.capTable + 4) =
                 local_268.content.size_._4_4_;
            (pBStack_330->source)._reader.data =
                 (void *)CONCAT44(local_268.content.disposer._4_4_,local_268.content.disposer._0_4_)
            ;
            (pBStack_330->source)._reader.pointers = (WirePointer *)CONCAT44(uStack_24c,uStack_250);
            (pBStack_330->source)._reader.dataSize = local_248;
            (pBStack_330->source)._reader.pointerCount = (short)uStack_244;
            *(short *)&(pBStack_330->source)._reader.field_0x26 = (short)((uint)uStack_244 >> 0x10);
            *(ulong *)&(pBStack_330->source)._reader.nestingLimit = CONCAT44(uStack_23c,uStack_240);
            pBStack_330 = pBStack_330 + 1;
            uVar57 = (BrandScope *)0x0;
          }
          if (bVar59 != false) {
            if ((BrandScope *)uVar57 != (BrandScope *)0x0) {
              (**pDVar51->_vptr_Disposer)
                        (pDVar51,&((NullableValue<capnp::compiler::BrandedDecl> *)
                                  &((BrandScope *)uVar57)->super_Refcounted)->isSet +
                                 *(long *)(*(long *)&((BrandScope *)uVar57)->super_Refcounted +
                                          -0x10));
              uVar57 = (BrandScope *)0x0;
            }
            if (uVar42 == 1) {
              uVar42 = 0;
            }
            uVar58 = ZEXT48(uVar42);
            if (uVar42 == 2) {
              uVar58 = (BrandScope *)0x0;
            }
          }
          index = index + 1;
        } while ((ElementCount)local_3a0 != index);
        if (((ulong)local_3a8 & 1) == 0) goto LAB_0015f994;
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = local_468._8_4_;
        if (local_468._8_4_ == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(local_468._20_4_,local_468._16_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_468._28_4_,local_468._24_4_);
        }
        else if (local_468._8_4_ == 1) {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_468._48_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT26(local_468._38_2_,CONCAT24(local_468._36_2_,local_468._32_4_));
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_468._40_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
               CONCAT44(local_468._20_4_,local_468._16_4_);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(local_468._28_4_,local_468._24_4_);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_468[0x38];
          if (local_468[0x38] == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_468._96_8_;
            *(Disposer **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_400;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_468._80_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_468._88_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_468._64_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_468._72_8_;
            local_468[0x38] = 0;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_3f8;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBStack_3f0;
        pBStack_3f0 = (BrandScope *)0x0;
        pNVar5 = &__return_storage_ptr__->ptr;
        *(uint *)((long)&pNVar5->field_1 + 0x98) = uStack_3c8;
        *(short *)((long)&pNVar5->field_1 + 0x9c) = (short)uStack_3c4;
        *(short *)((long)&pNVar5->field_1 + 0x9e) = SUB42(uStack_3c4,2);
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             CONCAT44(uStack_3bc,uStack_3c0);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             (void *)CONCAT44(uStack_3d4,uStack_3d8);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             (WirePointer *)CONCAT44(uStack_3cc,local_3d0);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
             (SegmentReader *)CONCAT44(uStack_3e4,uStack_3e8);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
             (CapTableReader *)CONCAT44(iStack_3dc,uStack_3e0);
      }
      pBVar10 = local_328;
      pBVar9 = pBStack_330;
      pBVar8 = local_338;
      if (local_338 != (BrandedDecl *)0x0) {
        local_338 = (BrandedDecl *)0x0;
        pBStack_330 = (BrandedDecl *)0x0;
        local_328 = (BrandedDecl *)0x0;
        (**local_320->_vptr_ArrayDisposer)
                  (local_320,pBVar8,0xa8,((long)pBVar9 - (long)pBVar8 >> 3) * -0x30c30c30c30c30c3,
                   ((long)pBVar10 - (long)pBVar8 >> 3) * -0x30c30c30c30c30c3,
                   kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
      }
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    pBVar37 = pBStack_3f0;
    if ((local_468[0] == '\x01') && (pBStack_3f0 != (BrandScope *)0x0)) {
      pBStack_3f0 = (BrandScope *)0x0;
      (**(local_3f8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_3f8,
                 &((NullableValue<capnp::compiler::BrandedDecl> *)&pBVar37->super_Refcounted)->isSet
                 + *(long *)(*(long *)&pBVar37->super_Refcounted + -0x10));
    }
    break;
  case 10:
    local_3b0 = (BrandScope *)source._reader.capTable;
    local_3a0 = source._reader.pointers;
    pCVar38 = source._reader.capTable;
    pSVar55 = source._reader.segment;
    uVar41 = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      pCVar38 = (CapTableReader *)0x0;
      pWVar43 = (WirePointer *)0x0;
      pSVar55 = (SegmentReader *)0x0;
      uVar41 = 0x7fffffff;
    }
    bVar59 = SUB81(pSVar55,0);
    uVar62 = SUB84(pCVar38,0);
    uVar65 = SUB87(pWVar43,0);
    uVar56 = (undefined1)((ulong)pWVar43 >> 0x38);
    capnp::_::PointerReader::getStruct
              (&local_90,(PointerReader *)&stack0xfffffffffffffae8,(word *)0x0);
    implicitMethodParams_00.params.reader.step = implicitMethodParams.params.reader.step;
    implicitMethodParams_00.params.reader.elementCount =
         implicitMethodParams.params.reader.elementCount;
    source_00._reader.capTable = local_90.capTable;
    source_00._reader.segment = local_90.segment;
    source_00._reader.data = local_90.data;
    source_00._reader.pointers = local_90.pointers;
    source_00._reader.dataSize = local_90.dataSize;
    source_00._reader.pointerCount = local_90.pointerCount;
    source_00._reader._38_2_ = local_90._38_2_;
    source_00._reader.nestingLimit = local_90.nestingLimit;
    source_00._reader._44_4_ = local_90._44_4_;
    implicitMethodParams_00.params.reader.segment = implicitMethodParams.params.reader.segment;
    implicitMethodParams_00.scopeId = implicitMethodParams.scopeId;
    implicitMethodParams_00.params.reader.capTable = implicitMethodParams.params.reader.capTable;
    implicitMethodParams_00.params.reader.ptr = implicitMethodParams.params.reader.ptr;
    implicitMethodParams_00.params.reader.structDataSize =
         implicitMethodParams.params.reader.structDataSize;
    implicitMethodParams_00.params.reader.structPointerCount =
         implicitMethodParams.params.reader.structPointerCount;
    implicitMethodParams_00.params.reader.elementSize =
         implicitMethodParams.params.reader.elementSize;
    implicitMethodParams_00.params.reader._39_1_ = implicitMethodParams.params.reader._39_1_;
    implicitMethodParams_00.params.reader.nestingLimit =
         implicitMethodParams.params.reader.nestingLimit;
    implicitMethodParams_00.params.reader._44_4_ = implicitMethodParams.params.reader._44_4_;
    compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)&stack0xfffffffffffffae8,this,source_00,
               resolver,implicitMethodParams_00);
    uVar63 = local_468._16_4_;
    local_468[0] = bVar59;
    if (bVar59 == true) {
      local_468._8_4_ = uVar62;
      local_468._16_4_ = (undefined4)uVar65;
      if (uVar62 == 2) {
        local_468._20_4_ = (undefined4)(CONCAT17(uVar56,uVar65) >> 0x20);
        uVar63 = local_468._16_4_;
        local_468._24_4_ = uVar41;
      }
      else if (uVar62 == 1) {
        local_468._36_2_ = (undefined2)in_stack_fffffffffffffb0c;
        local_468._38_2_ = (undefined2)((uint)in_stack_fffffffffffffb0c >> 0x10);
        local_468._20_4_ = (undefined4)(CONCAT17(uVar56,uVar65) >> 0x20);
        uVar63 = local_468._16_4_;
        local_468._24_4_ = uVar41;
        if (local_4e0 == 1) {
          local_4e0 = 0;
        }
      }
      local_468._16_4_ = uVar63;
      local_3f8 = (BrandScope *)CONCAT44(uStack_4a4,local_4a8);
      pBStack_3f0 = (BrandScope *)uStack_4a0;
      uStack_4a0 = (BrandScope *)0x0;
    }
    if (bVar59 == true) {
      if (SVar6 < 2) {
        uVar41 = 0x7fffffff;
        pBVar37 = (BrandScope *)0x0;
        pWVar43 = (WirePointer *)0x0;
        pSVar55 = (SegmentReader *)0x0;
      }
      else {
        pWVar43 = local_3a0 + 1;
        pBVar37 = local_3b0;
        pSVar55 = pSVar45;
        uVar41 = uVar52;
      }
      uVar61 = (undefined6)((ulong)pSVar55 >> 8);
      uVar56 = (undefined1)((ulong)pSVar55 >> 0x38);
      uVar63 = SUB84(pBVar37,0);
      uVar62 = (undefined4)((ulong)pBVar37 >> 0x20);
      uVar65 = SUB87(pWVar43,0);
      uVar67 = (undefined1)((ulong)pWVar43 >> 0x38);
      capnp::_::PointerReader::getStruct
                ((StructReader *)&local_398,(PointerReader *)&stack0xfffffffffffffae8,(word *)0x0);
      if (local_398.structPointerCount == 0) {
        local_398.nestingLimit = 0x7fffffff;
        local_398.capTable = (CapTableReader *)0x0;
        local_368.data = (short *)0x0;
        local_398.segment = (SegmentReader *)0x0;
      }
      else {
        local_368.data = (void *)CONCAT44(local_398.step,local_398.elementCount);
      }
      local_368.pointers = (WirePointer *)CONCAT44(local_368.pointers._4_4_,local_398.nestingLimit);
      local_368.segment = local_398.segment;
      local_368.capTable = local_398.capTable;
      memberName.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_368,(void *)0x0,0);
      subSource_00._reader.pointerCount = source._reader.pointerCount;
      subSource_00._reader.dataSize = source._reader.dataSize;
      subSource_00._reader._38_2_ = source._reader._38_2_;
      subSource_00._reader._44_4_ = source._reader._44_4_;
      subSource_00._reader.nestingLimit = source._reader.nestingLimit;
      subSource_00._reader.capTable = source._reader.capTable;
      subSource_00._reader.segment = source._reader.segment;
      subSource_00._reader.data = source._reader.data;
      subSource_00._reader.pointers = source._reader.pointers;
      BrandedDecl::getMember(&local_318,(BrandedDecl *)(local_468 + 8),memberName,subSource_00);
      bVar59 = local_318.ptr.isSet;
      uVar36 = local_318.ptr.field_1.value.body.tag;
      if (local_318.ptr.isSet == true) {
        uVar32 = local_318.ptr.field_1._8_7_;
        uVar33 = local_318.ptr.field_1._15_1_;
        uVar63 = local_318.ptr.field_1._16_4_;
        uVar34 = local_318.ptr.field_1._20_4_;
        if ((local_318.ptr.field_1.value.body.tag != 2) &&
           (uVar32 = uVar65, uVar33 = uVar67, uVar63 = uVar41, uVar34 = in_stack_fffffffffffffb04,
           local_318.ptr.field_1.value.body.tag == 1)) {
          uStack_4e8 = local_318.ptr.field_1._40_7_;
          uStack_4e1 = local_318.ptr.field_1._47_1_;
          in_stack_fffffffffffffb0c =
               (undefined4)
               (CONCAT17(local_318.ptr.field_1._31_1_,
                         CONCAT16(local_318.ptr.field_1._30_1_,
                                  CONCAT24(local_318.ptr.field_1._28_2_,local_318.ptr.field_1._24_4_
                                          ))) >> 0x20);
          uStack_4f0 = (undefined7)
                       CONCAT44(local_318.ptr.field_1._36_4_,local_318.ptr.field_1._32_4_);
          uStack_4e9 = (undefined1)((uint)local_318.ptr.field_1._36_4_ >> 0x18);
          local_4e0 = local_318.ptr.field_1._48_1_;
          uVar32 = local_318.ptr.field_1._8_7_;
          uVar33 = local_318.ptr.field_1._15_1_;
          uVar63 = local_318.ptr.field_1._16_4_;
          uVar34 = local_318.ptr.field_1._20_4_;
          in_stack_fffffffffffffb08 = local_318.ptr.field_1._24_4_;
          if (local_318.ptr.field_1._48_1_ == 1) {
            local_4b8 = local_318.ptr.field_1._88_8_;
            uStack_4b0 = local_318.ptr.field_1._96_8_;
            local_4c8 = local_318.ptr.field_1._72_8_;
            uStack_4c0 = local_318.ptr.field_1._80_8_;
            local_4d8 = local_318.ptr.field_1._56_8_;
            uStack_4d0 = local_318.ptr.field_1._64_8_;
            local_318.ptr.field_1._48_1_ = 0;
            uVar34 = local_318.ptr.field_1._20_4_;
          }
        }
        in_stack_fffffffffffffb04 = uVar34;
        uVar41 = uVar63;
        uVar67 = uVar33;
        uVar65 = uVar32;
        local_4a8 = local_318.ptr.field_1._104_4_;
        uStack_4a4 = local_318.ptr.field_1._108_4_;
        uStack_4a0 = local_318.ptr.field_1.value.brand.ptr;
        local_498 = local_318.ptr.field_1._120_4_;
        uStack_494 = local_318.ptr.field_1._124_4_;
        uStack_490 = local_318.ptr.field_1._128_4_;
        uStack_48c = local_318.ptr.field_1._132_4_;
        local_488 = local_318.ptr.field_1._136_4_;
        uStack_484 = local_318.ptr.field_1._140_4_;
        uStack_480 = local_318.ptr.field_1._144_4_;
        uStack_47c = local_318.ptr.field_1._148_4_;
        local_478 = local_318.ptr.field_1.value.source._reader.dataSize;
        uStack_474 = local_318.ptr.field_1._156_4_;
        uStack_470 = local_318.ptr.field_1.value.source._reader.nestingLimit;
        uStack_46c = local_318.ptr.field_1._164_4_;
        local_318.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
        if (local_318.ptr.field_1.value.body.tag == 1) {
          uVar36 = 0;
        }
        uVar63 = local_318.ptr.field_1.value.body.tag;
        if (uVar36 == 2) {
          uVar36 = 0;
        }
      }
      local_318.ptr.field_1.value.body.tag = uVar36;
      if (local_318.ptr.isSet == true) {
        if (uVar63 == 1) {
          local_234 = 0;
          local_238 = 0;
          if (0x3f < source._reader.dataSize) {
            local_238 = *(undefined4 *)((long)source._reader.data + 4);
          }
          local_228 = CONCAT17(uVar67,uVar65);
          if (0x9f < source._reader.dataSize) {
            local_234 = *(undefined4 *)((long)source._reader.data + 0x10);
          }
          local_230 = 1;
          (*this->errorReporter->_vptr_ErrorReporter[2])();
          if (local_230 == 1) {
            local_230 = 0;
          }
          if (local_230 == 2) {
            local_230 = 0;
          }
        }
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = uVar63;
        if (uVar63 == 2) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT17(uVar67,uVar65);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(in_stack_fffffffffffffb04,uVar41);
        }
        else if (uVar63 == 1) {
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
               CONCAT17(uStack_4e1,uStack_4e8);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
               CONCAT17(uStack_4e9,uStack_4f0);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT17(uVar67,uVar65);
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
               CONCAT44(in_stack_fffffffffffffb04,uVar41);
          *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_4e0;
          if (local_4e0 == 1) {
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_4b8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_4b0;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_4c8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_4c0;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_4d8;
            *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_4d0;
          }
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer =
             (Disposer *)CONCAT44(uStack_4a4,local_4a8);
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)uStack_4a0;
        uStack_4a0 = (BrandScope *)0x0;
        pNVar5 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar5->field_1 + 0x98) = local_478;
        *(short *)((long)&pNVar5->field_1 + 0x9c) = (short)uStack_474;
        *(short *)((long)&pNVar5->field_1 + 0x9e) = (short)((uint)uStack_474 >> 0x10);
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             CONCAT44(uStack_46c,uStack_470);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
             (void *)CONCAT44(uStack_484,local_488);
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
             (WirePointer *)CONCAT44(uStack_47c,uStack_480);
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x78) = local_498;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x7c) = uStack_494;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x80) = uStack_490;
        *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x84) = uStack_48c;
      }
      else {
        pBVar37 = local_3b0;
        pWVar43 = local_3a0;
        if (SVar6 == 0) {
          uVar52 = 0x7fffffff;
          pSVar45 = (SegmentReader *)0x0;
          pBVar37 = (BrandScope *)(CapTableReader *)0x0;
          pWVar43 = (WirePointer *)0x0;
        }
        pEVar2 = this->errorReporter;
        local_318.ptr.isSet = SUB81(pSVar45,0);
        local_318.ptr._1_6_ = SUB86((ulong)pSVar45 >> 8,0);
        local_318.ptr._7_1_ = SUB81((ulong)pSVar45 >> 0x38,0);
        local_318.ptr.field_1.value.body.tag = (uint)pBVar37;
        local_318.ptr.field_1._4_4_ = (undefined4)((ulong)pBVar37 >> 0x20);
        local_318.ptr.field_1._8_7_ = SUB87(pWVar43,0);
        local_318.ptr.field_1._15_1_ = (undefined1)((ulong)pWVar43 >> 0x38);
        local_318.ptr.field_1._16_4_ = uVar52;
        capnp::_::PointerReader::getStruct(&local_f0,(PointerReader *)&local_318,(word *)0x0);
        name_00._reader.capTable._0_1_ = bVar59;
        name_00._reader.segment = (SegmentReader *)resolver;
        name_00._reader.capTable._1_6_ = uVar61;
        name_00._reader.capTable._7_1_ = uVar56;
        name_00._reader.data._0_4_ = uVar63;
        name_00._reader.data._4_4_ = uVar62;
        name_00._reader.pointers._0_7_ = uVar65;
        name_00._reader.pointers._7_1_ = uVar67;
        name_00._reader.dataSize = uVar41;
        name_00._reader._36_4_ = in_stack_fffffffffffffb04;
        name_00._reader.nestingLimit = in_stack_fffffffffffffb08;
        name_00._reader._44_4_ = in_stack_fffffffffffffb0c;
        expressionString(name_00);
        RVar60 = LocatedText::Reader::getValue((Reader *)&local_398);
        local_318.ptr.isSet = RVar60.super_StringPtr.content.ptr._0_1_;
        local_318.ptr._1_6_ = RVar60.super_StringPtr.content.ptr._1_6_;
        local_318.ptr._7_1_ = RVar60.super_StringPtr.content.ptr._7_1_;
        local_318.ptr.field_1.value.body.tag = RVar60.super_StringPtr.content.size_._0_4_;
        local_318.ptr.field_1._4_4_ = RVar60.super_StringPtr.content.size_._4_4_;
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  ((String *)&local_368,(kj *)0x2223ec,(char (*) [2])&local_268,
                   (String *)"\' has no member named \'",(char (*) [24])&local_318,
                   (Reader *)0x2223ec,(char (*) [2])local_f0.segment);
        pSVar45 = local_368.segment;
        if (local_368.capTable == (CapTableReader *)0x0) {
          pSVar45 = (SegmentReader *)0x237f1b;
        }
        uVar50 = 0;
        uVar54 = 0;
        if (0x1f < local_398.structDataSize) {
          uVar54 = (ulong)*(uint *)local_398.ptr;
        }
        if (0x3f < local_398.structDataSize) {
          uVar50 = (ulong)*(uint *)((long)local_398.ptr + 4);
        }
        (**pEVar2->_vptr_ErrorReporter)
                  (pEVar2,uVar54,uVar50,pSVar45,
                   (long)&(local_368.capTable)->_vptr_CapTableReader +
                   (ulong)(local_368.capTable == (CapTableReader *)0x0));
        kj::String::~String((String *)&local_368);
        kj::String::~String(&local_268);
        (__return_storage_ptr__->ptr).isSet = false;
      }
      if ((bVar59 == true) && ((BrandScope *)uStack_4a0 != (BrandScope *)0x0)) {
        (*(code *)**(undefined8 **)CONCAT44(uStack_4a4,local_4a8))
                  ((undefined8 *)CONCAT44(uStack_4a4,local_4a8),
                   uStack_4a0 + *(long *)(*(long *)uStack_4a0 + -0x10));
      }
    }
    else {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    pBVar37 = pBStack_3f0;
    if ((local_468[0] == '\x01') && (pBStack_3f0 != (BrandScope *)0x0)) {
      pBStack_3f0 = (BrandScope *)0x0;
      (**(local_3f8->super_Refcounted).super_Disposer._vptr_Disposer)
                (local_3f8,
                 &((NullableValue<capnp::compiler::BrandedDecl> *)&pBVar37->super_Refcounted)->isSet
                 + *(long *)(*(long *)&pBVar37->super_Refcounted + -0x10));
    }
    break;
  case 0xb:
    local_468._8_8_ = source._reader.capTable;
    local_468._0_8_ = source._reader.segment;
    local_468._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_468._8_8_ = (CapTableReader *)0x0;
      pWVar43 = (WirePointer *)0x0;
      local_468._0_8_ = (SegmentReader *)0x0;
      local_468._24_4_ = 0x7fffffff;
    }
    local_468._16_4_ = SUB84(pWVar43,0);
    local_468._20_4_ = (undefined4)((ulong)pWVar43 >> 0x20);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_398,(PointerReader *)local_468,(word *)0x0);
    (*resolver->_vptr_Resolver[5])(&local_318);
    local_368.data = (void *)0x0;
    local_368.segment = (SegmentReader *)0x0;
    local_368.capTable = (CapTableReader *)0x0;
    iVar35 = 0x7fffffff;
    if (local_398.structPointerCount != 0) {
      local_368.data = (void *)CONCAT44(local_398.step,local_398.elementCount);
      local_368.segment = local_398.segment;
      local_368.capTable = local_398.capTable;
      iVar35 = local_398.nestingLimit;
    }
    plVar4 = (long *)CONCAT17(local_318.ptr.field_1._31_1_,
                              CONCAT16(local_318.ptr.field_1._30_1_,
                                       CONCAT24(local_318.ptr.field_1._28_2_,
                                                local_318.ptr.field_1._24_4_)));
    local_368.pointers = (WirePointer *)CONCAT44(local_368.pointers._4_4_,iVar35);
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_368,(void *)0x0,0);
    (**(code **)(*plVar4 + 8))(local_468,plVar4,RVar60.super_StringPtr.content.ptr);
    if (local_468[0] == '\x01') {
      in_stack_fffffffffffffaf0 = local_468._8_4_;
      uVar56 = SUB41(local_468._20_4_,3);
      if (local_468._8_4_ == 2) {
        in_stack_fffffffffffffaf8 = (undefined7)CONCAT44(local_468._20_4_,local_468._16_4_);
        in_stack_fffffffffffffaff = uVar56;
      }
      else if ((local_468._8_4_ == 1) &&
              (in_stack_fffffffffffffaf8 = (undefined7)CONCAT44(local_468._20_4_,local_468._16_4_),
              in_stack_fffffffffffffaff = uVar56, local_468[0x38] == 1)) {
        local_468[0x38] = 0;
      }
      if (local_468._8_4_ == 1) {
        local_468._8_8_ = local_468._8_8_ & 0xffffffff00000000;
      }
      if (local_468._8_4_ == 2) {
        local_468._8_8_ = local_468._8_8_ & 0xffffffff00000000;
      }
    }
    if (local_468[0] == '\0') {
      local_468._16_4_ = local_398.elementCount;
      local_468._20_4_ = local_398.step;
      if (local_398.structPointerCount == 0) {
        local_398.nestingLimit = 0x7fffffff;
        local_398.capTable = (CapTableReader *)0x0;
        local_468._16_4_ = 0;
        local_468._20_4_ = 0;
        local_398.segment = (SegmentReader *)0x0;
      }
      pEVar2 = this->errorReporter;
      local_468._0_8_ = local_398.segment;
      local_468._8_8_ = local_398.capTable;
      local_468._24_4_ = local_398.nestingLimit;
      RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_468,(void *)0x0,0);
      local_368.segment = RVar60.super_StringPtr.content.ptr;
      local_468._0_8_ = "Not defined: ";
      local_468._8_8_ = (CapTableReader *)0xd;
      local_368.capTable = (CapTableReader *)(RVar60.super_StringPtr.content.size_ - 1);
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)&local_318,(_ *)local_468,(ArrayPtr<const_char> *)&local_368,
                 (ArrayPtr<const_char> *)&local_368);
      lVar3 = CONCAT44(local_318.ptr.field_1._4_4_,local_318.ptr.field_1.value.body.tag);
      if (lVar3 == 0) {
        pcVar44 = "";
      }
      else {
        pcVar44 = (char *)CONCAT17(local_318.ptr._7_1_,
                                   CONCAT61(local_318.ptr._1_6_,local_318.ptr.isSet));
      }
      uVar50 = 0;
      uVar54 = 0;
      if (0x1f < local_398.structDataSize) {
        uVar54 = (ulong)*(uint *)local_398.ptr;
      }
      if (0x3f < local_398.structDataSize) {
        uVar50 = (ulong)*(uint *)((long)local_398.ptr + 4);
      }
      (**pEVar2->_vptr_ErrorReporter)(pEVar2,uVar54,uVar50,pcVar44,lVar3 + (ulong)(lVar3 == 0));
      lVar3 = CONCAT17(local_318.ptr._7_1_,CONCAT61(local_318.ptr._1_6_,local_318.ptr.isSet));
      if (lVar3 != 0) {
        uVar58 = CONCAT44(local_318.ptr.field_1._4_4_,local_318.ptr.field_1.value.body.tag);
        local_318.ptr.isSet = false;
        local_318.ptr._1_6_ = 0;
        local_318.ptr._7_1_ = 0;
        local_318.ptr.field_1.value.body.tag = 0;
        local_318.ptr.field_1._4_4_ = 0;
        (*(code *)**(undefined8 **)
                    CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_))
                  ((undefined8 *)CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_),
                   lVar3,1,uVar58,uVar58,0);
      }
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      source_01._reader.pointerCount = source._reader.pointerCount;
      source_01._reader.dataSize = source._reader.dataSize;
      source_01._reader._38_2_ = source._reader._38_2_;
      source_01._reader._44_4_ = source._reader._44_4_;
      source_01._reader.nestingLimit = source._reader.nestingLimit;
      source_01._reader.capTable = source._reader.capTable;
      source_01._reader.segment = source._reader.segment;
      source_01._reader.data = source._reader.data;
      source_01._reader.pointers = source._reader.pointers;
      interpretResolve((BrandedDecl *)local_468,this,resolver,
                       (ResolveResult *)&stack0xfffffffffffffaf0,source_01);
      if (in_stack_fffffffffffffaf0 == 1) {
        local_1f4 = 0;
        local_1f8 = 0;
        if (0x3f < source._reader.dataSize) {
          local_1f8 = *(undefined4 *)((long)source._reader.data + 4);
        }
        if (0x9f < source._reader.dataSize) {
          local_1f4 = *(undefined4 *)((long)source._reader.data + 0x10);
        }
        local_1e8 = CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8);
        local_1f0 = 1;
        (*this->errorReporter->_vptr_ErrorReporter[2])();
      }
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = local_468._0_4_;
      if (local_468._0_4_ == 2) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_468._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_468._20_4_,local_468._16_4_);
      }
      else if (local_468._0_4_ == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_468._40_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
             CONCAT44(local_468._28_4_,local_468._24_4_);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) =
             CONCAT26(local_468._38_2_,CONCAT24(local_468._36_2_,local_468._32_4_));
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_468._8_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             CONCAT44(local_468._20_4_,local_468._16_4_);
        *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_468[0x30];
        if (local_468[0x30] == '\x01') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_468._88_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_468._96_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_468._72_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = local_468._80_8_;
          *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
               CONCAT71(local_468._57_7_,local_468[0x38]);
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = local_468._64_8_;
        }
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = local_400;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = local_3f8;
      pNVar5 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = local_3d0;
      *(short *)((long)&pNVar5->field_1 + 0x9c) = (short)uStack_3cc;
      *(short *)((long)&pNVar5->field_1 + 0x9e) = SUB42(uStack_3cc,2);
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           CONCAT44(uStack_3c4,uStack_3c8);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data =
           (void *)CONCAT44(iStack_3dc,uStack_3e0);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers =
           (WirePointer *)CONCAT44(uStack_3d4,uStack_3d8);
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment =
           (SegmentReader *)pBStack_3f0;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable =
           (CapTableReader *)CONCAT44(uStack_3e4,uStack_3e8);
    }
    break;
  case 0xc:
    uVar50 = 0x7fffffff;
    local_468._8_8_ = source._reader.capTable;
    local_468._0_8_ = source._reader.segment;
    local_468._24_4_ = source._reader.nestingLimit;
    if (source._reader.pointerCount == 0) {
      local_468._8_8_ = (CapTableReader *)0x0;
      pWVar43 = (WirePointer *)0x0;
      local_468._0_8_ = (SegmentReader *)0x0;
      local_468._24_4_ = 0x7fffffff;
    }
    local_468._16_4_ = SUB84(pWVar43,0);
    local_468._20_4_ = (undefined4)((ulong)pWVar43 >> 0x20);
    pRVar53 = (Reader *)0x0;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_318,(PointerReader *)local_468,(word *)0x0);
    local_468._16_4_ = 0;
    local_468._20_4_ = 0;
    local_468._0_8_ = (SegmentReader *)0x0;
    if (local_318.ptr.field_1._28_2_ != 0) {
      local_468._0_8_ =
           CONCAT17(local_318.ptr._7_1_,CONCAT61(local_318.ptr._1_6_,local_318.ptr.isSet));
      pRVar53 = (Reader *)CONCAT44(local_318.ptr.field_1._4_4_,local_318.ptr.field_1.value.body.tag)
      ;
      uVar50 = (ulong)(uint)local_318.ptr.field_1._32_4_;
      local_468._16_4_ = local_318.ptr.field_1._16_4_;
      local_468._20_4_ = local_318.ptr.field_1._20_4_;
    }
    local_468._24_4_ = (undefined4)uVar50;
    local_468._8_8_ = pRVar53;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_468,(void *)0x0,0)
    ;
    (*resolver->_vptr_Resolver[8])(local_468,resolver,RVar60.super_StringPtr.content.ptr);
    pRVar53 = &source;
    pMVar39 = __return_storage_ptr__;
    uVar52 = (uint)resolver;
    if (local_468[0] == '\x01') {
      local_198 = CONCAT44(local_468._24_4_,local_468._20_4_);
      uStack_190 = CONCAT44(local_468._32_4_,local_468._28_4_);
      local_188 = CONCAT22(local_468._38_2_,local_468._36_2_);
      uVar50 = local_468._48_8_ & 0xff;
      pRVar53 = (Reader *)local_468._8_8_;
      pMVar39 = (Maybe<capnp::compiler::BrandedDecl> *)local_468._40_8_;
      uVar52 = local_468._16_4_;
      if (local_468[0x30] == '\x01') {
        in_stack_fffffffffffffb0c._3_1_ = (undefined1)local_468._88_8_;
        uStack_4f0 = SUB87(local_468._88_8_,1);
        uStack_4e9 = (undefined1)local_468._96_8_;
        uStack_4e8 = SUB87(local_468._96_8_,1);
        in_stack_fffffffffffffaff = (undefined1)local_468._72_8_;
        in_stack_fffffffffffffb00 = SUB84(local_468._72_8_,1);
        in_stack_fffffffffffffb04._0_3_ = SUB83(local_468._72_8_,5);
        in_stack_fffffffffffffb04._3_1_ = (undefined1)local_468._80_8_;
        in_stack_fffffffffffffb08 = SUB84(local_468._80_8_,1);
        in_stack_fffffffffffffb0c._0_3_ = SUB83(local_468._80_8_,5);
        in_stack_fffffffffffffaf0 = (undefined4)local_468._57_7_;
        in_stack_fffffffffffffaf4._0_3_ = SUB73(local_468._57_7_,4);
        in_stack_fffffffffffffaf4._3_1_ = (undefined1)local_468._64_8_;
        in_stack_fffffffffffffaf8 = SUB87(local_468._64_8_,1);
        local_468._48_8_ = local_468._48_8_ & 0xffffffffffffff00;
        in_stack_fffffffffffffaef = local_468[0x38];
      }
    }
    pEVar2 = this->errorReporter;
    if (local_468[0] != '\0') {
      local_214 = 0;
      local_218 = 0;
      if (0x3f < source._reader.dataSize) {
        local_218 = *(undefined4 *)((long)source._reader.data + 4);
      }
      if (0x9f < source._reader.dataSize) {
        local_214 = *(undefined4 *)((long)source._reader.data + 0x10);
      }
      local_210 = 1;
      local_208 = pRVar53;
      (*pEVar2->_vptr_ErrorReporter[2])(pEVar2);
      if (local_210 == 1) {
        local_210 = 0;
      }
      if (local_210 == 2) {
        local_210 = 0;
      }
      if ((uVar50 & 1) != 0) {
        local_158 = CONCAT35((int3)in_stack_fffffffffffffaf4,
                             CONCAT41(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaef));
        uStack_150 = CONCAT71(in_stack_fffffffffffffaf8,
                              (char)((uint)in_stack_fffffffffffffaf4 >> 0x18));
        local_148 = CONCAT35((int3)in_stack_fffffffffffffb04,
                             CONCAT41(in_stack_fffffffffffffb00,in_stack_fffffffffffffaff));
        uStack_140 = CONCAT35((int3)in_stack_fffffffffffffb0c,
                              CONCAT41(in_stack_fffffffffffffb08,
                                       (char)((uint)in_stack_fffffffffffffb04 >> 0x18)));
        local_138 = CONCAT71(uStack_4f0,(char)((uint)in_stack_fffffffffffffb0c >> 0x18));
        uStack_130 = CONCAT71(uStack_4e8,uStack_4e9);
      }
      pEVar2 = this->errorReporter;
      pBVar37 = (BrandScope *)operator_new(0x50);
      BrandScope(pBVar37,pEVar2,(uint64_t)pRVar53,uVar52,(Resolver *)pMVar39);
      puVar1 = &(pBVar37->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
      *(Reader **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = pRVar53;
      *(uint *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 8) = uVar52;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x14) = local_198;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x1c) = uStack_190;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1.value.body.field_1 + 0x1c) =
           local_188;
      *(Maybe<capnp::compiler::BrandedDecl> **)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28)
           = pMVar39;
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = (char)uVar50;
      if ((uVar50 & 1) != 0) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_138;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_130;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_148;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_140;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_158;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_150;
      }
      (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)pBVar37;
      (__return_storage_ptr__->ptr).field_1.value.brand.ptr = pBVar37;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = source._reader.segment;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.data = source._reader.data;
      (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = source._reader.pointers;
      pNVar5 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar5->field_1 + 0x98) = source._reader.dataSize;
      *(StructPointerCount *)((long)&pNVar5->field_1 + 0x9c) = source._reader.pointerCount;
      *(undefined2 *)((long)&pNVar5->field_1 + 0x9e) = source._reader._38_2_;
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
           CONCAT44(source._reader._44_4_,source._reader.nestingLimit);
      return __return_storage_ptr__;
    }
    if (local_318.ptr.field_1._28_2_ == 0) {
      local_318.ptr.field_1._32_4_ = 0x7fffffff;
      local_468._8_8_ = (CapTableReader *)0x0;
      local_468._16_4_ = 0;
      local_468._20_4_ = 0;
      local_468._0_8_ = (SegmentReader *)0x0;
    }
    else {
      local_468._0_8_ =
           CONCAT17(local_318.ptr._7_1_,CONCAT61(local_318.ptr._1_6_,local_318.ptr.isSet));
      local_468._8_8_ = CONCAT44(local_318.ptr.field_1._4_4_,local_318.ptr.field_1.value.body.tag);
      local_468._16_4_ = local_318.ptr.field_1._16_4_;
      local_468._20_4_ = local_318.ptr.field_1._20_4_;
    }
    local_468._24_4_ = local_318.ptr.field_1._32_4_;
    RVar60 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_468,(void *)0x0,0)
    ;
    local_368.segment = RVar60.super_StringPtr.content.ptr;
    local_468._0_8_ = "Import failed: ";
    local_468._8_8_ = (CapTableReader *)0xf;
    local_368.capTable = (CapTableReader *)(RVar60.super_StringPtr.content.size_ - 1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((String *)&local_398,(_ *)local_468,(ArrayPtr<const_char> *)&local_368,
               (ArrayPtr<const_char> *)&local_368);
    pSVar45 = local_398.segment;
    if (local_398.capTable == (CapTableReader *)0x0) {
      pSVar45 = (SegmentReader *)0x237f1b;
    }
    uVar50 = 0;
    uVar54 = 0;
    if (0x1f < (uint)local_318.ptr.field_1._24_4_) {
      uVar54 = (ulong)*(uint *)CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_);
    }
    if (0x3f < (uint)local_318.ptr.field_1._24_4_) {
      uVar50 = (ulong)*(uint *)(CONCAT17(local_318.ptr.field_1._15_1_,local_318.ptr.field_1._8_7_) +
                               4);
    }
    (**pEVar2->_vptr_ErrorReporter)
              (pEVar2,uVar54,uVar50,pSVar45,
               (long)&(local_398.capTable)->_vptr_CapTableReader +
               (ulong)(local_398.capTable == (CapTableReader *)0x0));
    pCVar38 = local_398.capTable;
    pSVar45 = local_398.segment;
    if (local_398.segment != (SegmentReader *)0x0) {
      local_398.segment = (SegmentReader *)0x0;
      local_398.capTable = (CapTableReader *)0x0;
      (*(code *)**(undefined8 **)local_398.ptr)(local_398.ptr,pSVar45,1,pCVar38,pCVar38,0);
    }
switchD_0015e182_caseD_0:
    (__return_storage_ptr__->ptr).isSet = false;
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return kj::none;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return kj::none;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_SOME(r, resolver.resolve(nameValue)) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return kj::none;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_SOME(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        auto result = interpretResolve(resolver, r, source);
        if (r.is<Resolver::ResolvedDecl>()){
          errorReporter.reportResolution(Resolution {
            /* .startByte = */ source.getStartByte(),
            /* .endByte = */ source.getEndByte(),
            /* .target = */ Resolution::Type { r.get<Resolver::ResolvedDecl>().id },
          });
        }
        return kj::mv(result);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return kj::none;
      }
    }